

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswDyn.c
# Opt level: O2

void Ssw_ManLoadSolver(Ssw_Man_t *p,Aig_Obj_t *pRepr,Aig_Obj_t *pObj)

{
  Vec_Ptr_t *vNewPis;
  sat_solver *s;
  int iVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pAVar3;
  long lVar4;
  
  if (pRepr == pObj) {
    __assert_fail("pRepr != pObj",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswDyn.c"
                  ,0x94,"void Ssw_ManLoadSolver(Ssw_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
  }
  iVar1 = p->pPars->nFramesK;
  pAVar2 = (Aig_Obj_t *)
           ((ulong)p->pNodeToFrames[pRepr->Id * p->nFrames + iVar1] & 0xfffffffffffffffe);
  pAVar3 = (Aig_Obj_t *)
           ((ulong)p->pNodeToFrames[p->nFrames * pObj->Id + iVar1] & 0xfffffffffffffffe);
  if (pAVar2 != pAVar3) {
    Ssw_CnfNodeAddToSolver(p->pMSat,pAVar2);
    Ssw_CnfNodeAddToSolver(p->pMSat,pAVar3);
    vNewPis = p->vNewLos;
    vNewPis->nSize = 0;
    Ssw_ManCollectPis_rec(pAVar2,vNewPis);
    Ssw_ManCollectPis_rec(pAVar3,p->vNewLos);
    p->vNewPos->nSize = 0;
    for (iVar1 = 0; iVar1 < p->vNewLos->nSize; iVar1 = iVar1 + 1) {
      pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p->vNewLos,iVar1);
      Ssw_ManCollectPos_rec(p,pAVar2,p->vNewPos);
    }
    for (lVar4 = 0; lVar4 < p->vNewPos->nSize; lVar4 = lVar4 + 1) {
      iVar1 = p->vNewPos->pArray[lVar4];
      pAVar2 = Aig_ManCo(p->pFrames,iVar1 * 2);
      pAVar3 = Aig_ManCo(p->pFrames,iVar1 * 2 + 1);
      if (((*(ulong *)&pAVar2->field_0x18 & 0x20) != 0) || ((pAVar3->field_0x18 & 0x20) != 0)) {
        *(ulong *)&pAVar2->field_0x18 = *(ulong *)&pAVar2->field_0x18 | 0x20;
        pAVar3->field_0x18 = pAVar3->field_0x18 | 0x20;
        Ssw_NodesAreConstrained(p,pAVar2->pFanin0,pAVar3->pFanin0);
      }
    }
    s = p->pMSat->pSat;
    if (s->qtail != s->qhead) {
      iVar1 = sat_solver_simplify(s);
      if (iVar1 == 0) {
        __assert_fail("RetValue != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswDyn.c"
                      ,0xc4,"void Ssw_ManLoadSolver(Ssw_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
      }
    }
    return;
  }
  __assert_fail("pReprFrames != pObjFrames",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswDyn.c"
                ,0x98,"void Ssw_ManLoadSolver(Ssw_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
}

Assistant:

void Ssw_ManLoadSolver( Ssw_Man_t * p, Aig_Obj_t * pRepr, Aig_Obj_t * pObj )
{
    Aig_Obj_t * pObjFrames, * pReprFrames;
    Aig_Obj_t * pTemp, * pObj0, * pObj1;
    int i, iConstr, RetValue;

    assert( pRepr != pObj );
    // get the corresponding frames nodes
    pReprFrames = Aig_Regular( Ssw_ObjFrame( p, pRepr, p->pPars->nFramesK ) );
    pObjFrames  = Aig_Regular( Ssw_ObjFrame( p, pObj,  p->pPars->nFramesK ) );
    assert( pReprFrames != pObjFrames );
 /*
    // compute the AIG support
    Vec_PtrClear( p->vNewLos );
    Ssw_ManCollectPis_rec( pRepr, p->vNewLos );
    Ssw_ManCollectPis_rec( pObj,  p->vNewLos );
    // add logic cones for register outputs
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vNewLos, pTemp, i )
    {
        pObj0 = Aig_Regular( Ssw_ObjFrame( p, pTemp, p->pPars->nFramesK ) );
        Ssw_CnfNodeAddToSolver( p->pMSat, pObj0 );
    }
*/
    // add cones for the nodes
    Ssw_CnfNodeAddToSolver( p->pMSat, pReprFrames );
    Ssw_CnfNodeAddToSolver( p->pMSat, pObjFrames );

    // compute the frames support
    Vec_PtrClear( p->vNewLos );
    Ssw_ManCollectPis_rec( pReprFrames, p->vNewLos );
    Ssw_ManCollectPis_rec( pObjFrames,  p->vNewLos );
    // these nodes include both nodes corresponding to PIs and LOs
    // (the nodes corresponding to PIs should be labeled with fMarkB!)

    // collect the related constraint POs
    Vec_IntClear( p->vNewPos );
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vNewLos, pTemp, i )
        Ssw_ManCollectPos_rec( p, pTemp, p->vNewPos );
    // check if the corresponding pairs are added
    Vec_IntForEachEntry( p->vNewPos, iConstr, i )
    {
        pObj0 = Aig_ManCo( p->pFrames, 2*iConstr   );
        pObj1 = Aig_ManCo( p->pFrames, 2*iConstr+1 );
//        if ( pObj0->fMarkB && pObj1->fMarkB )
        if ( pObj0->fMarkB || pObj1->fMarkB )
        {
            pObj0->fMarkB = 1;
            pObj1->fMarkB = 1;
            Ssw_NodesAreConstrained( p, Aig_ObjChild0(pObj0), Aig_ObjChild0(pObj1) );
        }
    }
    if ( p->pMSat->pSat->qtail != p->pMSat->pSat->qhead )
    {
        RetValue = sat_solver_simplify(p->pMSat->pSat);
        assert( RetValue != 0 );
    }
}